

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void LogPrintf_<std::__cxx11::string,long,std::__cxx11::string>
               (string_view logging_function,string_view source_file,int source_line,LogFlags flag,
               Level level,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,long *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  bool bVar1;
  Logger *pLVar2;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  long in_FS_OFFSET;
  string_view str;
  undefined4 in_stack_0000000c;
  string log_msg;
  string local_78;
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_2_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flag;
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  if (bVar1) {
    local_58 = &local_48;
    local_50 = 0;
    local_48 = '\0';
    tinyformat::format<std::__cxx11::string,long,std::__cxx11::string>
              (&local_78,
               (tinyformat *)"Timeout downloading block %s from peer=%d%s, disconnecting\n",
               (char *)CONCAT44(in_register_00000084,source_line),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flag,
               (long *)CONCAT44(in_stack_0000000c,level),args_2_00);
    LogPrintf_<std::__cxx11::string,long,std::__cxx11::string>();
    pLVar2 = LogInstance();
    str._M_str = local_58;
    str._M_len = local_50;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x1876,ALL,Info);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void LogPrintf_(std::string_view logging_function, std::string_view source_file, const int source_line, const BCLog::LogFlags flag, const BCLog::Level level, const char* fmt, const Args&... args)
{
    if (LogInstance().Enabled()) {
        std::string log_msg;
        try {
            log_msg = tfm::format(fmt, args...);
        } catch (tinyformat::format_error& fmterr) {
            /* Original format string will have newline so don't add one here */
            log_msg = "Error \"" + std::string(fmterr.what()) + "\" while formatting log message: " + fmt;
        }
        LogInstance().LogPrintStr(log_msg, logging_function, source_file, source_line, flag, level);
    }
}